

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::GetItem
               (RecyclableObject *instance,uint64 index,Var *value,ScriptContext *requestContext)

{
  BOOL BVar1;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  if (index < 0xffffffff) {
    BVar1 = GetItem(instance,(uint32)index,value,requestContext);
    return BVar1;
  }
  local_30 = (PropertyRecord *)0x0;
  GetPropertyIdForInt(index,requestContext,&local_30);
  BVar1 = GetProperty(instance,local_30->pid,value,requestContext,(PropertyValueInfo *)0x0);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::GetItem(RecyclableObject* instance, uint64 index, Var* value, ScriptContext* requestContext)
    {
        if (index < JavascriptArray::InvalidIndex)
        {
            // In case index fits in uint32, we can avoid the (slower) big-index path
            return GetItem(instance, static_cast<uint32>(index), value, requestContext);
        }
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptOperators::GetPropertyIdForInt(index, requestContext, &propertyRecord);
        return JavascriptOperators::GetProperty(instance, propertyRecord->GetPropertyId(), value, requestContext);
    }